

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::Angle_to_Quat
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar6;
  undefined1 auVar15 [16];
  double dVar7;
  undefined1 auVar16 [64];
  ulong extraout_XMM0_Qb;
  undefined1 auVar17 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar18 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_ZMM5 [64];
  double dVar55;
  undefined1 auVar56 [16];
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_ZMM8 [64];
  double in_XMM9_Qa;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar2 = in_ZMM2._0_16_;
  auVar21 = in_ZMM1._0_16_;
  auVar63 = in_ZMM8._0_16_;
  auVar49 = in_ZMM5._0_16_;
  switch(angset) {
  case EULERO:
    dVar6 = cos(mangles->m_data[0]);
    in_XMM9_Qa = cos(mangles->m_data[1]);
    dVar4 = cos(mangles->m_data[2]);
    dVar55 = sin(mangles->m_data[0]);
    dVar5 = sin(mangles->m_data[1]);
    auVar16._0_8_ = sin(mangles->m_data[2]);
    auVar16._8_56_ = extraout_var;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar55;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar6;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar4;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar55 * -in_XMM9_Qa * auVar16._0_8_;
    auVar21 = vfmadd231sd_fma(auVar34,auVar58,auVar47);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar4 * dVar55 * -in_XMM9_Qa;
    auVar2 = vfnmadd231sd_fma(auVar20,auVar16._0_16_,auVar47);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = in_XMM9_Qa * dVar6 * auVar16._0_8_;
    auVar63 = vfmadd231sd_fma(auVar48,auVar58,auVar61);
    auVar21 = vunpcklpd_avx(auVar21,auVar2);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar55 * dVar5;
    auVar63 = vunpcklpd_avx(auVar35,auVar63);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = in_XMM9_Qa * dVar6 * dVar4;
    auVar2 = vfnmadd231sd_fma(auVar36,auVar16._0_16_,auVar61);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar6 * -dVar5;
    auVar2 = vunpcklpd_avx(auVar2,auVar25);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5 * auVar16._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar5 * dVar4;
    auVar49 = vunpcklpd_avx(auVar8,auVar37);
    break;
  case CARDANO:
    dVar6 = cos(mangles->m_data[0]);
    dVar4 = cos(mangles->m_data[1]);
    dVar55 = cos(mangles->m_data[2]);
    local_68._0_8_ = sin(mangles->m_data[0]);
    local_68._8_8_ = extraout_XMM0_Qb_01;
    local_78._0_8_ = sin(mangles->m_data[1]);
    local_78._8_8_ = extraout_XMM0_Qb_02;
    auVar19._0_8_ = sin(mangles->m_data[2]);
    auVar19._8_56_ = extraout_var_02;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar6;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar55;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (double)local_78._0_8_ * (double)local_68._0_8_ * auVar19._0_8_;
    auVar21 = vfmsub231sd_fma(auVar31,auVar53,auVar59);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar4 * -(double)local_68._0_8_;
    auVar21 = vunpcklpd_avx(auVar21,auVar24);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar55 * (double)local_68._0_8_ * (double)local_78._0_8_;
    auVar63 = vfmadd231sd_fma(auVar32,auVar53,auVar19._0_16_);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar6 * (double)local_78._0_8_ * auVar19._0_8_;
    auVar2 = vfmadd231sd_fma(auVar54,local_68,auVar59);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar55 * dVar6 * (double)local_78._0_8_;
    auVar9 = vfmsub231sd_fma(auVar46,local_68,auVar19._0_16_);
    auVar63 = vunpcklpd_avx(auVar63,auVar2);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar4 * -auVar19._0_8_;
    auVar49 = vunpcklpd_avx(auVar11,local_78);
    in_XMM9_Qa = dVar4 * dVar55;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = dVar4 * dVar6;
    auVar2 = vunpcklpd_avx(auVar33,auVar9);
    break;
  case HPB:
    dVar6 = cos(mangles->m_data[1]);
    dVar4 = cos(mangles->m_data[0]);
    dVar55 = cos(mangles->m_data[2]);
    dVar5 = sin(mangles->m_data[1]);
    dVar3 = sin(mangles->m_data[0]);
    auVar17._0_8_ = sin(mangles->m_data[2]);
    auVar17._8_56_ = extraout_var_00;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar55;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar3;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar4;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar3 * dVar5 * auVar17._0_8_;
    auVar21 = vfmsub231sd_fma(auVar22,auVar26,auVar65);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar4 * dVar5 * auVar17._0_8_;
    auVar49 = vfmadd231sd_fma(auVar39,auVar73,auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar3 * dVar55 * dVar5;
    auVar63 = vfnmsub231sd_fma(auVar27,auVar17._0_16_,auVar65);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar4 * dVar55 * dVar5;
    auVar9 = vfnmadd231sd_fma(auVar43,auVar17._0_16_,auVar73);
    in_XMM9_Qa = dVar4 * dVar6;
    auVar21 = vunpcklpd_avx(auVar21,auVar63);
    auVar28._0_8_ = -dVar5;
    auVar28._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar3 * -dVar6;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar6 * auVar17._0_8_;
    auVar63 = vunpcklpd_avx(auVar50,auVar56);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar55 * dVar6;
    auVar2 = vunpcklpd_avx(auVar51,auVar28);
    auVar49 = vunpcklpd_avx(auVar49,auVar9);
    break;
  case RXYZ:
    dVar6 = cos(mangles->m_data[0]);
    dVar4 = cos(mangles->m_data[1]);
    dVar55 = cos(mangles->m_data[2]);
    dVar5 = sin(mangles->m_data[0]);
    local_78._0_8_ = sin(mangles->m_data[1]);
    local_78._8_8_ = extraout_XMM0_Qb_00;
    auVar18._0_8_ = sin(mangles->m_data[2]);
    auVar18._8_56_ = extraout_var_01;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar55;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar55 * dVar4;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = dVar4 * auVar18._0_8_;
    auVar21 = vunpcklpd_avx(auVar23,auVar29);
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar2 = vxorpd_avx512vl(local_78,auVar1);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar5 * (double)local_78._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar18._0_8_ * dVar6;
    auVar63 = vfmsub231sd_fma(auVar44,auVar40,auVar66);
    auVar63 = vunpcklpd_avx(auVar2,auVar63);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar55 * dVar6;
    auVar2 = vfmadd231sd_fma(auVar30,auVar18._0_16_,auVar40);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar5 * auVar18._0_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar6 * (double)local_78._0_8_;
    auVar49 = vfmadd231sd_fma(auVar45,auVar74,auVar66);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar55 * dVar5;
    auVar9 = vfmsub231sd_fma(auVar52,auVar74,auVar18._0_16_);
    in_XMM9_Qa = dVar6 * dVar4;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar5 * dVar4;
    auVar2 = vunpcklpd_avx(auVar2,auVar41);
    auVar49 = vunpcklpd_avx(auVar49,auVar9);
    break;
  case RODRIGUEZ:
    dVar6 = mangles->m_data[0];
    auVar9._8_8_ = dVar6;
    auVar9._0_8_ = dVar6;
    auVar21 = *(undefined1 (*) [16])(mangles->m_data + 1);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = mangles->m_data[2];
    dVar6 = dVar6 * dVar6;
    dVar55 = auVar21._0_8_;
    dVar4 = dVar55 * dVar55;
    auVar64._0_8_ = dVar55 * dVar55;
    auVar64._8_8_ = auVar21._8_8_ * auVar21._8_8_;
    auVar2 = vfmsub213sd_fma(auVar21,auVar9,auVar62);
    auVar49 = vfmsub213sd_fma(auVar62,auVar21,auVar9);
    auVar63 = vshufpd_avx(auVar21,auVar21,1);
    auVar1 = vfmadd213pd_fma(auVar63,auVar9,auVar21);
    auVar63 = vshufpd_avx(auVar64,auVar64,1);
    dVar5 = auVar63._0_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = ((dVar6 + 1.0) - dVar4) - dVar5;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auVar2._0_8_ + auVar2._0_8_;
    auVar2 = vunpcklpd_avx(auVar38,auVar68);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = ((1.0 - dVar6) + dVar4) - dVar5;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auVar49._0_8_ + auVar49._0_8_;
    auVar49 = vunpcklpd_avx(auVar69,auVar71);
    auVar63 = vfmsub213sd_fma(auVar62,auVar9,auVar21);
    auVar21 = vfmadd213sd_fma(auVar62,auVar21,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar21._0_8_ + auVar21._0_8_;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auVar63._0_8_ + auVar63._0_8_;
    auVar9 = vunpcklpd_avx(auVar72,auVar10);
    dVar55 = 1.0 / (dVar5 + dVar6 + dVar4 + 1.0);
    in_XMM9_Qa = (dVar5 + ((1.0 - dVar6) - dVar4)) * dVar55;
    auVar63._0_8_ = (auVar1._0_8_ + auVar1._0_8_) * dVar55;
    auVar63._8_8_ = (auVar1._8_8_ + auVar1._8_8_) * dVar55;
    auVar21._0_8_ = auVar2._0_8_ * dVar55;
    auVar21._8_8_ = auVar2._8_8_ * dVar55;
    auVar2._0_8_ = auVar49._0_8_ * dVar55;
    auVar2._8_8_ = auVar49._8_8_ * dVar55;
    auVar49._0_8_ = auVar9._0_8_ * dVar55;
    auVar49._8_8_ = auVar9._8_8_ * dVar55;
  }
  dVar60 = auVar63._0_8_;
  dVar5 = auVar49._0_8_;
  dVar4 = auVar21._0_8_;
  dVar55 = auVar2._0_8_;
  auVar21 = vshufpd_avx(auVar21,auVar21,1);
  dVar3 = auVar21._0_8_;
  auVar21 = vshufpd_avx(auVar63,auVar63,1);
  dVar57 = auVar21._0_8_;
  auVar21 = vshufpd_avx(auVar2,auVar2,1);
  dVar67 = auVar21._0_8_;
  auVar21 = vshufpd_avx(auVar49,auVar49,1);
  dVar70 = auVar21._0_8_;
  dVar6 = in_XMM9_Qa + dVar55 + dVar4;
  if (0.0 <= dVar6) {
    dVar6 = dVar6 + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar6;
      auVar21 = vsqrtsd_avx(auVar13,auVar13);
      dVar6 = auVar21._0_8_;
    }
    dVar42 = dVar6 * 0.5;
    dVar6 = 0.5 / dVar6;
    dVar4 = (dVar70 - dVar67) * dVar6;
    dVar55 = (dVar60 - dVar5) * dVar6;
    dVar6 = (dVar57 - dVar3) * dVar6;
    goto LAB_004eee1e;
  }
  if (dVar55 <= dVar4) {
    if (dVar4 < in_XMM9_Qa) goto LAB_004eebfb;
    dVar6 = ((dVar4 - dVar55) - in_XMM9_Qa) + 1.0;
    if (dVar6 < 0.0) {
      dVar7 = sqrt(dVar6);
    }
    else {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar6;
      auVar21 = vsqrtsd_avx(auVar15,auVar15);
      dVar7 = auVar21._0_8_;
    }
    dVar42 = dVar70 - dVar67;
    dVar4 = dVar7 * 0.5;
    dVar7 = 0.5 / dVar7;
    dVar55 = (dVar57 + dVar3) * dVar7;
    dVar6 = (dVar60 + dVar5) * dVar7;
  }
  else if (dVar55 < in_XMM9_Qa) {
LAB_004eebfb:
    dVar6 = ((in_XMM9_Qa - dVar4) - dVar55) + 1.0;
    if (dVar6 < 0.0) {
      dVar7 = sqrt(dVar6);
    }
    else {
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar6;
      auVar21 = vsqrtsd_avx(auVar14,auVar14);
      dVar7 = auVar21._0_8_;
    }
    dVar42 = dVar57 - dVar3;
    dVar6 = dVar7 * 0.5;
    dVar7 = 0.5 / dVar7;
    dVar4 = (dVar60 + dVar5) * dVar7;
    dVar55 = (dVar70 + dVar67) * dVar7;
  }
  else {
    dVar6 = ((dVar55 - in_XMM9_Qa) - dVar4) + 1.0;
    if (dVar6 < 0.0) {
      dVar7 = sqrt(dVar6);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar6;
      auVar21 = vsqrtsd_avx(auVar12,auVar12);
      dVar7 = auVar21._0_8_;
    }
    dVar42 = dVar60 - dVar5;
    dVar55 = dVar7 * 0.5;
    dVar7 = 0.5 / dVar7;
    dVar6 = (dVar70 + dVar67) * dVar7;
    dVar4 = (dVar57 + dVar3) * dVar7;
  }
  dVar42 = dVar42 * dVar7;
LAB_004eee1e:
  __return_storage_ptr__->m_data[0] = dVar42;
  __return_storage_ptr__->m_data[1] = dVar4;
  __return_storage_ptr__->m_data[2] = dVar55;
  __return_storage_ptr__->m_data[3] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Angle_to_Quat(AngleSet angset, const ChVector<double>& mangles) {
    ChQuaternion<double> res;
    ChMatrix33<> Acoord;

    switch (angset) {
        case AngleSet::EULERO:
            Acoord.Set_A_Eulero(mangles);
            break;
        case AngleSet::CARDANO:
            Acoord.Set_A_Cardano(mangles);
            break;
        case AngleSet::HPB:
            Acoord.Set_A_Hpb(mangles);
            break;
        case AngleSet::RXYZ:
            Acoord.Set_A_Rxyz(mangles);
            break;
        case AngleSet::RODRIGUEZ:
            Acoord.Set_A_Rodriguez(mangles);
            break;
        default:
            break;
    }
    res = Acoord.Get_A_quaternion();
    return res;
}